

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_uv.cc
# Opt level: O3

int UVScale(uint8_t *src_uv,int src_stride_uv,int src_width,int src_height,uint8_t *dst_uv,
           int dst_stride_uv,int dst_width,int dst_height,FilterMode filtering)

{
  uint uVar1;
  int iVar2;
  FilterMode filtering_00;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  code *pcVar13;
  code *pcVar14;
  ulong uVar15;
  uint8_t *puVar16;
  uint8_t *local_b8;
  int y;
  int local_a0;
  int x;
  ulong local_98;
  code *local_90;
  uint8_t *local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  code *local_68;
  code *local_60;
  code *local_58;
  uint local_4c;
  uint local_48;
  int dx;
  long local_40;
  code *local_38;
  
  if (dst_height < 1) {
    return -1;
  }
  if (dst_width < 1) {
    return -1;
  }
  if (dst_uv == (uint8_t *)0x0) {
    return -1;
  }
  if (0x8000 < src_height) {
    return -1;
  }
  if (0x8000 < src_width) {
    return -1;
  }
  if (src_uv == (uint8_t *)0x0) {
    return -1;
  }
  if (src_width == 0) {
    return -1;
  }
  if (src_height == 0) {
    return -1;
  }
  x = 0;
  y = 0;
  dx = 0;
  local_48 = 0;
  filtering_00 = ScaleFilterReduce(src_width,src_height,dst_width,dst_height,filtering);
  local_b8 = src_uv;
  if (src_height < 0) {
    local_b8 = src_uv + ~src_height * src_stride_uv;
    src_stride_uv = -src_stride_uv;
    src_height = -src_height;
  }
  local_90 = (code *)CONCAT44(local_90._4_4_,src_height);
  local_a0 = dst_stride_uv;
  ScaleSlope(src_width,src_height,dst_width,dst_height,filtering_00,&x,&y,&dx,(int *)&local_48);
  iVar10 = dx;
  uVar8 = y;
  uVar15 = (ulong)(uint)-src_width;
  if (0 < src_width) {
    uVar15 = (ulong)(uint)src_width;
  }
  local_98 = (ulong)dx;
  local_78 = (ulong)local_48;
  if ((short)(local_48 | dx) == 0) {
    if (local_48 == 0 || dx == 0) {
      filtering_00 = kFilterNone;
    }
    else {
      uVar5 = x >> 0xf;
      if (((local_48 | dx) >> 0x10 & 1) == 0) {
        if (dx == 0x20000) {
          if (filtering_00 == kFilterLinear) {
            pcVar14 = ScaleUVRowDown2Linear_C;
          }
          else {
            pcVar14 = ScaleUVRowDown2Box_C;
          }
          if (filtering_00 == kFilterNone) {
            pcVar14 = ScaleUVRowDown2_C;
          }
          uVar8 = (uVar5 & 0xfffffffe) - 2;
          if (filtering_00 == kFilterBilinear) {
            uVar8 = uVar5 & 0xfffffffe;
          }
          iVar10 = (int)y._2_2_;
          uVar5 = cpu_info_;
          if (cpu_info_ == 0) {
            uVar5 = InitCpuFlags();
          }
          if ((dst_width & 3U) == 0) {
            pcVar13 = ScaleUVRowDown2Box_SSSE3;
          }
          else {
            pcVar13 = ScaleUVRowDown2Box_Any_SSSE3;
          }
          iVar4 = (int)local_78;
          if ((uVar5 & 0x40) == 0) {
            pcVar13 = pcVar14;
          }
          if (filtering_00 == kFilterNone) {
            pcVar13 = pcVar14;
          }
          uVar5 = cpu_info_;
          if (cpu_info_ == 0) {
            uVar5 = InitCpuFlags();
          }
          iVar4 = (iVar4 >> 0x10) * src_stride_uv;
          if ((dst_width & 7U) == 0) {
            pcVar14 = ScaleUVRowDown2Box_AVX2;
          }
          else {
            pcVar14 = ScaleUVRowDown2Box_Any_AVX2;
          }
          local_b8 = local_b8 + (int)(uVar8 + iVar10 * src_stride_uv);
          if ((uVar5 & 0x400) == 0) {
            pcVar14 = pcVar13;
          }
          if (filtering_00 == kFilterNone) {
            pcVar14 = pcVar13;
          }
          if (filtering_00 == kFilterLinear) {
            src_stride_uv = 0;
          }
          lVar6 = (long)local_a0;
          do {
            (*pcVar14)(local_b8,(long)src_stride_uv,dst_uv,dst_width);
            local_b8 = local_b8 + iVar4;
            dst_uv = dst_uv + lVar6;
            dst_height = dst_height + -1;
          } while (dst_height != 0);
          return 0;
        }
        uVar8 = ((int)local_48 >> 0x10) * src_stride_uv;
        if (filtering_00 != kFilterBox || dx != 0x40000) {
          if (filtering_00 == kFilterNone) {
            pcVar14 = ScaleUVRowDownEven_C;
          }
          else {
            pcVar14 = ScaleUVRowDownEvenBox_C;
          }
          local_98 = (ulong)(uint)(dx >> 0x10);
          iVar10 = 0;
          if (filtering_00 != kFilterLinear) {
            iVar10 = src_stride_uv;
          }
          local_b8 = local_b8 + (int)((uVar5 & 0xfffffffe) + y._2_2_ * src_stride_uv);
          lVar6 = (long)local_a0;
          do {
            (*pcVar14)(local_b8,(long)iVar10,local_98,dst_uv,dst_width);
            local_b8 = local_b8 + (int)uVar8;
            dst_uv = dst_uv + lVar6;
            dst_height = dst_height + -1;
          } while (dst_height != 0);
          return 0;
        }
        iVar10 = (int)y._2_2_;
        uVar3 = dst_width * 4 + 0xfU & 0xfffffff0;
        local_98 = (ulong)uVar3;
        local_90 = (code *)malloc((ulong)(uVar3 * 2 + 0x3f));
        uVar3 = cpu_info_;
        if (cpu_info_ == 0) {
          uVar3 = InitCpuFlags();
        }
        if ((dst_width & 3U) == 0) {
          pcVar14 = ScaleUVRowDown2Box_SSSE3;
        }
        else {
          pcVar14 = ScaleUVRowDown2Box_Any_SSSE3;
        }
        if ((uVar3 & 0x40) == 0) {
          pcVar14 = ScaleUVRowDown2Box_C;
        }
        pcVar13 = local_90 + 0x3f;
        uVar3 = cpu_info_;
        local_78 = (ulong)uVar8;
        if (cpu_info_ == 0) {
          uVar3 = InitCpuFlags();
        }
        uVar15 = local_98;
        uVar12 = (ulong)pcVar13 & 0xffffffffffffffc0;
        if ((dst_width & 7U) == 0) {
          pcVar13 = ScaleUVRowDown2Box_AVX2;
        }
        else {
          pcVar13 = ScaleUVRowDown2Box_Any_AVX2;
        }
        local_b8 = local_b8 + (int)(iVar10 * src_stride_uv + (uVar5 & 0xfffffffe));
        if ((uVar3 >> 10 & 1) == 0) {
          pcVar13 = pcVar14;
        }
        iVar10 = dst_width * 2;
        local_98 = CONCAT44(local_98._4_4_,iVar10);
        uVar9 = (ulong)src_stride_uv;
        local_68 = (code *)(uVar15 & 0xffffffff);
        local_60 = local_68 + uVar12;
        local_78 = (ulong)(int)local_78;
        local_88 = (uint8_t *)(long)local_a0;
        local_80 = uVar9;
        local_70 = uVar12;
        do {
          (*pcVar13)(local_b8,uVar9,uVar12,iVar10);
          (*pcVar13)(local_b8 + src_stride_uv * 2,uVar9,local_60,iVar10);
          (*pcVar13)(uVar12,local_68,dst_uv,dst_width);
          local_b8 = local_b8 + local_78;
          dst_uv = dst_uv + (long)local_88;
          dst_height = dst_height + -1;
          pcVar14 = local_90;
        } while (dst_height != 0);
        goto LAB_001509ee;
      }
      if ((((dx & local_48) >> 0x10 & 1) != 0) &&
         (filtering_00 = kFilterNone, local_48 == 0x10000 && dx == 0x10000)) {
        if (local_b8 == (uint8_t *)0x0) {
          return 0;
        }
        CopyPlane(local_b8 + (long)(y._2_2_ * src_stride_uv) + (long)(int)(uVar5 & 0xfffffffe),
                  src_stride_uv,dst_uv,local_a0,dst_width * 2,dst_height);
        return 0;
      }
    }
  }
  uVar12 = (ulong)(uint)x;
  if ((x & 0xffffU) == 0 && dx == 0x10000) {
    ScalePlaneVertical((uint)local_90,dst_width,dst_height,src_stride_uv,local_a0,local_b8,dst_uv,x,
                       y,local_48,4,filtering_00);
    return 0;
  }
  uVar5 = (uint)uVar15;
  local_80 = uVar12;
  if ((int)local_48 < 0x10000 && filtering_00 != kFilterNone) {
    uVar3 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar3 = InitCpuFlags();
    }
    if ((dst_width & 3U) == 0) {
      pcVar14 = InterpolateRow_SSSE3;
    }
    else {
      pcVar14 = InterpolateRow_Any_SSSE3;
    }
    if ((uVar3 & 0x40) == 0) {
      pcVar14 = InterpolateRow_C;
    }
    uVar3 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar3 = InitCpuFlags();
    }
    if ((dst_width & 7U) == 0) {
      local_68 = InterpolateRow_AVX2;
    }
    else {
      local_68 = InterpolateRow_Any_AVX2;
    }
    uVar1 = (uint)local_90 * 0x10000 - 0x10000;
    local_70 = CONCAT44(local_70._4_4_,uVar1);
    if ((uVar3 >> 10 & 1) == 0) {
      local_68 = pcVar14;
    }
    if (uVar5 < 0x8000) {
      local_58 = ScaleUVFilterCols_C;
    }
    else {
      local_58 = ScaleUVFilterCols64_C;
    }
    local_4c = uVar8;
    if ((int)uVar1 < (int)uVar8) {
      local_4c = uVar1;
    }
    iVar10 = (int)local_4c >> 0x10;
    local_88 = local_b8 + iVar10 * src_stride_uv;
    local_60 = (code *)CONCAT44(local_60._4_4_,dst_width * 2);
    uVar8 = dst_width * 2 + 0xfU & 0xfffffff0;
    local_38 = (code *)malloc((ulong)(uVar8 * 2 + 0x3f));
    pcVar14 = local_58;
    uVar15 = (ulong)(local_38 + 0x3f) & 0xffffffffffffffc0;
    (*local_58)(uVar15,local_88,dst_width,local_80,local_98);
    local_40 = (long)src_stride_uv;
    lVar6 = 0;
    if (1 < (uint)local_90) {
      lVar6 = local_40;
    }
    puVar16 = local_88 + lVar6;
    local_88 = (uint8_t *)(ulong)uVar8;
    (*pcVar14)(uVar8 + uVar15,puVar16,dst_width,local_80,local_98);
    puVar16 = puVar16 + local_40;
    iVar4 = (int)(uint)local_70 >> 0x10;
    local_90 = (code *)CONCAT44(local_90._4_4_,iVar4);
    lVar6 = (long)local_a0;
    uVar8 = local_4c;
    do {
      if ((int)uVar8 >> 0x10 != iVar10) {
        iVar2 = (int)uVar8 >> 0x10;
        if ((int)(uint)local_70 < (int)uVar8) {
          puVar16 = local_b8 + src_stride_uv * iVar4;
          iVar2 = (uint)local_90;
        }
        if ((int)(uint)local_70 <= (int)uVar8) {
          uVar8 = (uint)local_70;
        }
        if (iVar2 != iVar10) {
          (*local_58)(uVar15,puVar16,dst_width,local_80,local_98);
          uVar15 = uVar15 + (long)(int)local_88;
          local_88 = (uint8_t *)(ulong)(uint)-(int)local_88;
          puVar16 = puVar16 + local_40;
          iVar10 = iVar2;
        }
      }
      if (filtering_00 == kFilterLinear) {
        lVar7 = 0;
        uVar5 = 0;
      }
      else {
        uVar5 = uVar8 >> 8 & 0xff;
        lVar7 = (long)(int)local_88;
      }
      (*local_68)(dst_uv,uVar15,lVar7,local_60._0_4_,uVar5);
      dst_uv = dst_uv + lVar6;
      uVar8 = uVar8 + (int)local_78;
      dst_height = dst_height + -1;
      pcVar14 = local_38;
    } while (dst_height != 0);
  }
  else {
    if (filtering_00 == kFilterNone) {
      if (uVar5 < 0x8000) {
        pcVar14 = ScaleUVCols_C;
      }
      else {
        pcVar14 = ScaleUVCols64_C;
      }
      pcVar13 = pcVar14;
      if (x < 0x8000) {
        pcVar13 = ScaleUVColsUp2_C;
      }
      if (uVar5 * 2 == dst_width) {
        pcVar14 = pcVar13;
      }
      lVar6 = (long)local_a0;
      iVar4 = y;
      do {
        (*pcVar14)(dst_uv,local_b8 + (iVar4 >> 0x10) * src_stride_uv,dst_width,uVar12,iVar10);
        dst_uv = dst_uv + lVar6;
        iVar4 = iVar4 + (int)local_78;
        dst_height = dst_height + -1;
      } while (dst_height != 0);
      return 0;
    }
    lVar6 = (long)x;
    if (uVar5 < 0x8000) {
      local_68 = ScaleUVFilterCols_C;
    }
    else {
      local_68 = ScaleUVFilterCols64_C;
    }
    lVar11 = (dst_width - 1) * local_98 + lVar6;
    lVar7 = lVar11;
    if (dx < 0) {
      lVar7 = lVar6;
      lVar6 = lVar11;
    }
    uVar9 = lVar6 >> 0x10 & 0xfffffffffffffffc;
    uVar12 = (lVar7 >> 0x10) + 5U & 0xfffffffffffffffc;
    if ((long)uVar15 <= (long)uVar12) {
      uVar12 = uVar15;
    }
    iVar4 = (int)uVar9;
    uVar3 = (int)uVar12 - iVar4;
    uVar5 = cpu_info_;
    iVar10 = x;
    if (cpu_info_ == 0) {
      uVar5 = InitCpuFlags();
      iVar10 = (int)local_80;
    }
    if ((uVar3 & 7) == 0) {
      pcVar14 = InterpolateRow_SSSE3;
    }
    else {
      pcVar14 = InterpolateRow_Any_SSSE3;
    }
    if ((uVar5 & 0x40) == 0) {
      pcVar14 = InterpolateRow_C;
    }
    uVar5 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar5 = InitCpuFlags();
      iVar10 = (int)local_80;
    }
    if ((uVar3 & 0xf) == 0) {
      local_60 = InterpolateRow_AVX2;
    }
    else {
      local_60 = InterpolateRow_Any_AVX2;
    }
    local_88 = (uint8_t *)CONCAT44(local_88._4_4_,uVar3 * 2);
    local_80 = (ulong)(uint)(iVar10 + iVar4 * -0x10000);
    if ((uVar5 >> 10 & 1) == 0) {
      local_60 = pcVar14;
    }
    local_58 = (code *)malloc((long)(int)(uVar3 * 4 + 0x3f));
    pcVar13 = local_58 + 0x3f;
    uVar5 = (uint)local_90 * 0x10000 - 0x10000;
    if ((int)uVar5 < (int)uVar8) {
      uVar8 = uVar5;
    }
    local_70 = (ulong)src_stride_uv;
    lVar6 = (long)local_a0;
    do {
      puVar16 = local_b8 + (long)(((int)uVar8 >> 0x10) * src_stride_uv) + uVar9 * 2;
      if (filtering_00 != kFilterLinear) {
        (*local_60)((uint8_t *)((ulong)pcVar13 & 0xffffffffffffffc0),
                    local_b8 + (long)(((int)uVar8 >> 0x10) * src_stride_uv) + uVar9 * 2,local_70,
                    (ulong)local_88 & 0xffffffff,uVar8 >> 8 & 0xff);
        puVar16 = (uint8_t *)((ulong)pcVar13 & 0xffffffffffffffc0);
      }
      (*local_68)(dst_uv,puVar16,dst_width,local_80,local_98);
      dst_uv = dst_uv + lVar6;
      uVar8 = uVar8 + (int)local_78;
      if ((int)uVar5 <= (int)uVar8) {
        uVar8 = uVar5;
      }
      dst_height = dst_height + -1;
      pcVar14 = local_58;
    } while (dst_height != 0);
  }
LAB_001509ee:
  free(pcVar14);
  return 0;
}

Assistant:

LIBYUV_API
int UVScale(const uint8_t* src_uv,
            int src_stride_uv,
            int src_width,
            int src_height,
            uint8_t* dst_uv,
            int dst_stride_uv,
            int dst_width,
            int dst_height,
            enum FilterMode filtering) {
  if (!src_uv || src_width == 0 || src_height == 0 || src_width > 32768 ||
      src_height > 32768 || !dst_uv || dst_width <= 0 || dst_height <= 0) {
    return -1;
  }
  ScaleUV(src_uv, src_stride_uv, src_width, src_height, dst_uv, dst_stride_uv,
          dst_width, dst_height, 0, 0, dst_width, dst_height, filtering);
  return 0;
}